

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * __thiscall
CTPNStmReturnBase::fold_constants(CTPNStmReturnBase *this,CTcPrsSymtab *symtab)

{
  CTcTokenizer *this_00;
  CTcTokFileDesc *desc;
  long linenum;
  _func_int **pp_Var1;
  undefined8 in_RSI;
  CTPNStmBase *in_RDI;
  
  this_00 = G_tok;
  desc = CTPNStmBase::get_source_desc(in_RDI);
  linenum = CTPNStmBase::get_source_linenum(in_RDI);
  CTcTokenizer::set_line_info(this_00,desc,linenum);
  if (in_RDI[1].super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase != (_func_int **)0x0) {
    pp_Var1 = in_RDI[1].super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase;
    pp_Var1 = (_func_int **)(**(code **)(*pp_Var1 + 0x78))(pp_Var1,in_RSI);
    in_RDI[1].super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = pp_Var1;
  }
  return &in_RDI->super_CTcPrsNode;
}

Assistant:

CTcPrsNode *CTPNStmReturnBase::fold_constants(CTcPrsSymtab *symtab)
{
    /* set our location for any errors that occur */
    G_tok->set_line_info(get_source_desc(), get_source_linenum());

    /* fold constants in the expression, if we have one */
    if (expr_ != 0)
        expr_ = expr_->fold_constants(symtab);

    /* we are not directly changed by this operation */
    return this;
}